

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint32_t rebuild_hflags_a64(CPUARMState_conflict *env,int el,int fp_el,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  ARMMMUIdx AVar5;
  TCR *pTVar6;
  uint64_t uVar7;
  ulong uVar8;
  ARMMMUIdx AVar9;
  ARMMMUIdx local_34;
  
  uVar2 = rebuild_hflags_aprofile(env);
  if (fp_el == 0x10) {
    local_34 = ARMMMUIdx_Stage1_E0;
  }
  else if (fp_el == 0x13) {
    local_34 = ARMMMUIdx_Stage1_E1_PAN;
  }
  else {
    local_34 = fp_el;
    if (fp_el == 0x12) {
      local_34 = ARMMMUIdx_Stage1_E1;
    }
  }
  pTVar6 = regime_tcr(env,fp_el);
  uVar7 = pTVar6->raw_tcr;
  uVar3 = aa64_va_parameter_tbi(uVar7,fp_el);
  uVar4 = aa64_va_parameter_tbid(uVar7,fp_el);
  AVar9 = (uVar3 & 3) * 0x1000 + (uVar2 & 0x7fffcffc | ~uVar4 & uVar3 & 3) + 0x80000000;
  _Var1 = isar_feature_aa64_sve((ARMISARegisters *)(env[1].xregs + 7));
  if (_Var1) {
    uVar3 = sve_exception_el_aarch64(env,el);
    AVar5 = 0;
    if (uVar3 == 0) {
      uVar2 = sve_zcr_len_for_el_aarch64(env,el);
      AVar5 = uVar2 << 4;
    }
    AVar9 = (AVar9 & 0xffffff03) + (uVar3 & 3) * 4 | AVar5;
  }
  uVar7 = regime_sctlr(env,local_34);
  AVar5 = AVar9 | 0x10000000;
  if (((uint)uVar7 & (uint)(el != 0) * 0x1000000 + 0x1000000) == 0) {
    AVar5 = AVar9;
  }
  uVar8 = (ulong)AVar5;
  AVar9 = AVar5 | 0x100;
  if ((env[1].xregs[0x11] & 0xff000ff0) == 0) {
    AVar9 = AVar5;
  }
  if ((uVar7 & 0xc8002000) == 0) {
    AVar9 = AVar5;
  }
  _Var1 = isar_feature_aa64_bti((ARMISARegisters *)(env[1].xregs + 7));
  if (_Var1) {
    uVar8 = ((ulong)(el != 0) << 0x23) + 0x800000000;
    if ((uVar7 & uVar8) != 0) {
      AVar9 = AVar9 | 0x200;
    }
  }
  if (((env->pstate & 0x800000) == 0) && ((uint)fp_el < 0x1a)) {
    if ((0x30c0000U >> (fp_el & 0x1fU) & 1) == 0) {
      if ((0x600000U >> (fp_el & 0x1fU) & 1) != 0) {
        AVar9 = AVar9 | (uint)(env->cp15).hcr_el2 >> 0xd & 0x4000;
      }
    }
    else {
      AVar9 = AVar9 | 0x4000;
    }
  }
  uVar2 = rebuild_hflags_common(env,fp_el,AVar9,(uint32_t)uVar8);
  return uVar2;
}

Assistant:

static uint32_t rebuild_hflags_a64(CPUARMState *env, int el, int fp_el,
                                   ARMMMUIdx mmu_idx)
{
    uint32_t flags = rebuild_hflags_aprofile(env);
    ARMMMUIdx stage1 = stage_1_mmu_idx(mmu_idx);
    uint64_t tcr = regime_tcr(env, mmu_idx)->raw_tcr;
    uint64_t sctlr;
    int tbii, tbid;

    FIELD_DP32(flags, TBFLAG_ANY, AARCH64_STATE, 1, flags);

    /* Get control bits for tagged addresses.  */
    tbid = aa64_va_parameter_tbi(tcr, mmu_idx);
    tbii = tbid & ~aa64_va_parameter_tbid(tcr, mmu_idx);

    FIELD_DP32(flags, TBFLAG_A64, TBII, tbii, flags);
    FIELD_DP32(flags, TBFLAG_A64, TBID, tbid, flags);

    if (cpu_isar_feature(aa64_sve, env_archcpu(env))) {
        int sve_el = sve_exception_el(env, el);
        uint32_t zcr_len;

        /*
         * If SVE is disabled, but FP is enabled,
         * then the effective len is 0.
         */
        if (sve_el != 0 && fp_el == 0) {
            zcr_len = 0;
        } else {
            zcr_len = sve_zcr_len_for_el(env, el);
        }
        FIELD_DP32(flags, TBFLAG_A64, SVEEXC_EL, sve_el, flags);
        FIELD_DP32(flags, TBFLAG_A64, ZCR_LEN, zcr_len, flags);
    }

    sctlr = regime_sctlr(env, stage1);

    if (arm_cpu_data_is_big_endian_a64(el, sctlr)) {
        FIELD_DP32(flags, TBFLAG_ANY, BE_DATA, 1, flags);
    }

    if (cpu_isar_feature(aa64_pauth, env_archcpu(env))) {
        /*
         * In order to save space in flags, we record only whether
         * pauth is "inactive", meaning all insns are implemented as
         * a nop, or "active" when some action must be performed.
         * The decision of which action to take is left to a helper.
         */
        if (sctlr & (SCTLR_EnIA | SCTLR_EnIB | SCTLR_EnDA | SCTLR_EnDB)) {
            FIELD_DP32(flags, TBFLAG_A64, PAUTH_ACTIVE, 1, flags);
        }
    }

    if (cpu_isar_feature(aa64_bti, env_archcpu(env))) {
        /* Note that SCTLR_EL[23].BT == SCTLR_BT1.  */
        if (sctlr & (el == 0 ? SCTLR_BT0 : SCTLR_BT1)) {
            FIELD_DP32(flags, TBFLAG_A64, BT, 1, flags);
        }
    }

    /* Compute the condition for using AccType_UNPRIV for LDTR et al. */
    if (!(env->pstate & PSTATE_UAO)) {
        switch (mmu_idx) {
        case ARMMMUIdx_E10_1:
        case ARMMMUIdx_E10_1_PAN:
        case ARMMMUIdx_SE10_1:
        case ARMMMUIdx_SE10_1_PAN:
            /* TODO: ARMv8.3-NV */
            FIELD_DP32(flags, TBFLAG_A64, UNPRIV, 1, flags);
            break;
        case ARMMMUIdx_E20_2:
        case ARMMMUIdx_E20_2_PAN:
            /* TODO: ARMv8.4-SecEL2 */
            /*
             * Note that EL20_2 is gated by HCR_EL2.E2H == 1, but EL20_0 is
             * gated by HCR_EL2.<E2H,TGE> == '11', and so is LDTR.
             */
            if (env->cp15.hcr_el2 & HCR_TGE) {
                FIELD_DP32(flags, TBFLAG_A64, UNPRIV, 1, flags);
            }
            break;
        default:
            break;
        }
    }

    return rebuild_hflags_common(env, fp_el, mmu_idx, flags);
}